

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

void * C_std::IPC::Mmap(void *addr,size_t length,int prot,int flags,int fd,off_t offset)

{
  void *pvVar1;
  allocator local_31;
  string local_30;
  
  pvVar1 = mmap(addr,length,prot,flags,fd,offset);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    std::__cxx11::string::string((string *)&local_30,"mmap error",&local_31);
    perror_exit(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return pvVar1;
}

Assistant:

void *Mmap(void *addr, size_t length, int prot, int flags, int fd, off_t offset) {
            void *p = mmap(addr, length, prot, flags, fd, offset);
            if (p == MAP_FAILED) {
                perror_exit("mmap error");
            }
            return p;
        }